

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O1

REF_STATUS ref_mpi_all_or(REF_MPI ref_mpi,REF_BOOL *boolean)

{
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_all_or(REF_MPI ref_mpi, REF_BOOL *boolean) {
#ifdef HAVE_MPI
  REF_BOOL output;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_mpi_where_am_i(ref_mpi);
  MPI_Allreduce(boolean, &output, 1, MPI_INT, MPI_SUM, ref_mpi_comm(ref_mpi));
  *boolean = MIN(output, 1);

#else
  SUPRESS_UNUSED_COMPILER_WARNING(ref_mpi);
  SUPRESS_UNUSED_COMPILER_WARNING(boolean);
#endif

  return REF_SUCCESS;
}